

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O3

int * __thiscall despot::Grid<int>::operator()(Grid<int> *this,int x,int y)

{
  int iVar1;
  long in_RAX;
  undefined8 local_28;
  
  local_28 = in_RAX;
  despot::Coord::Coord((Coord *)&local_28,x,y);
  if ((((-1 < (int)local_28) && (-1 < local_28)) && ((int)local_28 < this->xsize_)) &&
     (local_28._4_4_ < this->ysize_)) {
    iVar1 = Index(this,x,y);
    return (this->grid_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + iVar1;
  }
  __assert_fail("Inside(Coord(x, y))",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/grid.h"
                ,0x3b,"const T &despot::Grid<int>::operator()(int, int) const [T = int]");
}

Assistant:

const T& operator()(int x, int y) const {
		assert(Inside(Coord(x, y)));
		return grid_[Index(x, y)];
	}